

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

size_t art_size_in_bytes(art_t *art)

{
  _Bool _Var1;
  art_t *in_RDI;
  art_typecode_t t;
  size_t size;
  byte local_19;
  size_t local_18;
  size_t local_8;
  
  _Var1 = art_is_shrunken(in_RDI);
  if (_Var1) {
    local_18 = 0x38;
    for (local_19 = 1; local_19 < 6; local_19 = local_19 + 1) {
      local_18 = in_RDI->capacities[local_19] * ART_NODE_SIZES[local_19] + local_18;
    }
    local_8 = local_18;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

size_t art_size_in_bytes(const art_t *art) {
    if (!art_is_shrunken(art)) {
        return 0;
    }
    // Root.
    size_t size = sizeof(art->root);
    // Node counts.
    size += sizeof(art->capacities);
    // Alignment for leaves. The rest of the nodes are aligned the same way.
    size +=
        ((size + alignof(art_leaf_t) - 1) & ~(alignof(art_leaf_t) - 1)) - size;
    for (art_typecode_t t = CROARING_ART_MIN_TYPE; t <= CROARING_ART_MAX_TYPE;
         ++t) {
        size += art->capacities[t] * ART_NODE_SIZES[t];
    }
    return size;
}